

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_pippenger_bucket_window(size_t n)

{
  int iVar1;
  
  if (n < 2) {
    iVar1 = 1;
  }
  else if (n < 5) {
    iVar1 = 2;
  }
  else if (n < 0x15) {
    iVar1 = 3;
  }
  else if (n < 0x3a) {
    iVar1 = 4;
  }
  else if (n < 0x89) {
    iVar1 = 5;
  }
  else if (n < 0xec) {
    iVar1 = 6;
  }
  else if (n < 0x4ed) {
    iVar1 = 7;
  }
  else if (n < 0x1145) {
    iVar1 = 9;
  }
  else {
    if (0x1ec8 < n) {
      return 0xc - (uint)(n < 0x3eb3);
    }
    iVar1 = 10;
  }
  return iVar1;
}

Assistant:

static int secp256k1_pippenger_bucket_window(size_t n) {
    if (n <= 1) {
        return 1;
    } else if (n <= 4) {
        return 2;
    } else if (n <= 20) {
        return 3;
    } else if (n <= 57) {
        return 4;
    } else if (n <= 136) {
        return 5;
    } else if (n <= 235) {
        return 6;
    } else if (n <= 1260) {
        return 7;
    } else if (n <= 4420) {
        return 9;
    } else if (n <= 7880) {
        return 10;
    } else if (n <= 16050) {
        return 11;
    } else {
        return PIPPENGER_MAX_BUCKET_WINDOW;
    }
}